

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_prot.c
# Opt level: O1

_Bool xdr_ncallhdr(XDR *xdrs,rpc_msg *cmsg)

{
  uint *puVar1;
  msg_type *pmVar2;
  anon_struct_448_2_6e6c6d68_for_ru *paVar3;
  rpcprog_t *prVar4;
  uint uVar5;
  xdr_op xVar6;
  msg_type mVar7;
  _Bool _Var8;
  rpcvers_t *prVar9;
  
  if (xdrs == (XDR *)0x0) {
    __assert_fail("xdrs != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/rpc_prot.c"
                  ,0xa5,"_Bool xdr_ncallhdr(XDR *, struct rpc_msg *)");
  }
  if (cmsg == (rpc_msg *)0x0) {
    __assert_fail("cmsg != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/rpc_prot.c"
                  ,0xa6,"_Bool xdr_ncallhdr(XDR *, struct rpc_msg *)");
  }
  cmsg->rm_direction = CALL;
  (cmsg->ru).RM_cmb = 2;
  if (xdrs->x_op != XDR_ENCODE) {
    return false;
  }
  uVar5 = cmsg->rm_xid;
  puVar1 = (uint *)((long)xdrs->x_data + 4);
  if ((xdrs->x_v).vio_wrap < puVar1) {
    _Var8 = (*xdrs->x_ops->x_putunit)(xdrs,uVar5);
    if (!_Var8) {
      return false;
    }
  }
  else {
    *(uint *)xdrs->x_data =
         uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    xdrs->x_data = (uint8_t *)puVar1;
  }
  xVar6 = xdrs->x_op;
  if (xVar6 != XDR_FREE) {
    pmVar2 = &cmsg->rm_direction;
    if (xVar6 == XDR_DECODE) {
      puVar1 = (uint *)((long)xdrs->x_data + 4);
      if ((xdrs->x_v).vio_tail < puVar1) {
        _Var8 = (*xdrs->x_ops->x_getunit)(xdrs,pmVar2);
        goto LAB_00111384;
      }
      uVar5 = *(uint *)xdrs->x_data;
      *pmVar2 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      xdrs->x_data = (uint8_t *)puVar1;
    }
    else {
      if (xVar6 != XDR_ENCODE) {
        return false;
      }
      mVar7 = *pmVar2;
      puVar1 = (uint *)((long)xdrs->x_data + 4);
      if ((xdrs->x_v).vio_wrap < puVar1) {
        _Var8 = (*xdrs->x_ops->x_putunit)(xdrs,mVar7);
LAB_00111384:
        if (_Var8 == false) {
          return false;
        }
      }
      else {
        *(msg_type *)xdrs->x_data =
             mVar7 >> 0x18 | (mVar7 & 0xff0000) >> 8 | (mVar7 & 0xff00) << 8 | mVar7 << 0x18;
        xdrs->x_data = (uint8_t *)puVar1;
      }
    }
  }
  xVar6 = xdrs->x_op;
  if (xVar6 != XDR_FREE) {
    paVar3 = &cmsg->ru;
    if (xVar6 == XDR_DECODE) {
      puVar1 = (uint *)((long)xdrs->x_data + 4);
      if ((xdrs->x_v).vio_tail < puVar1) {
        _Var8 = (*xdrs->x_ops->x_getunit)(xdrs,(uint32_t *)paVar3);
        goto LAB_001113e8;
      }
      uVar5 = *(uint *)xdrs->x_data;
      (paVar3->RM_cmb).cb_rpcvers =
           uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      xdrs->x_data = (uint8_t *)puVar1;
    }
    else {
      if (xVar6 != XDR_ENCODE) {
        return false;
      }
      uVar5 = (paVar3->RM_cmb).cb_rpcvers;
      puVar1 = (uint *)((long)xdrs->x_data + 4);
      if ((xdrs->x_v).vio_wrap < puVar1) {
        _Var8 = (*xdrs->x_ops->x_putunit)(xdrs,uVar5);
LAB_001113e8:
        if (_Var8 == false) {
          return false;
        }
      }
      else {
        *(uint *)xdrs->x_data =
             uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
        xdrs->x_data = (uint8_t *)puVar1;
      }
    }
  }
  xVar6 = xdrs->x_op;
  if (xVar6 != XDR_FREE) {
    prVar4 = &cmsg->cb_prog;
    if (xVar6 == XDR_DECODE) {
      puVar1 = (uint *)((long)xdrs->x_data + 4);
      if (puVar1 <= (xdrs->x_v).vio_tail) {
        uVar5 = *(uint *)xdrs->x_data;
        *prVar4 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
        xdrs->x_data = (uint8_t *)puVar1;
        goto LAB_00111471;
      }
      _Var8 = (*xdrs->x_ops->x_getunit)(xdrs,prVar4);
    }
    else {
      if (xVar6 != XDR_ENCODE) {
        return false;
      }
      uVar5 = *prVar4;
      puVar1 = (uint *)((long)xdrs->x_data + 4);
      if (puVar1 <= (xdrs->x_v).vio_wrap) {
        *(uint *)xdrs->x_data =
             uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
        xdrs->x_data = (uint8_t *)puVar1;
        goto LAB_00111471;
      }
      _Var8 = (*xdrs->x_ops->x_putunit)(xdrs,uVar5);
    }
    if (_Var8 == false) {
      return false;
    }
  }
LAB_00111471:
  xVar6 = xdrs->x_op;
  if (xVar6 == XDR_FREE) {
    return true;
  }
  prVar9 = &cmsg->cb_vers;
  if (xVar6 == XDR_DECODE) {
    puVar1 = (uint *)((long)xdrs->x_data + 4);
    if ((xdrs->x_v).vio_tail < puVar1) {
      _Var8 = (*xdrs->x_ops->x_getunit)(xdrs,prVar9);
      return _Var8;
    }
    uVar5 = *(uint *)xdrs->x_data;
    *prVar9 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    xdrs->x_data = (uint8_t *)puVar1;
    return true;
  }
  if (xVar6 != XDR_ENCODE) {
    return false;
  }
  uVar5 = *prVar9;
  puVar1 = (uint *)((long)xdrs->x_data + 4);
  if ((xdrs->x_v).vio_wrap < puVar1) {
    _Var8 = (*xdrs->x_ops->x_putunit)(xdrs,uVar5);
    return _Var8;
  }
  *(uint *)xdrs->x_data =
       uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  xdrs->x_data = (uint8_t *)puVar1;
  return true;
}

Assistant:

bool
xdr_ncallhdr(XDR *xdrs, struct rpc_msg *cmsg)
{
	assert(xdrs != NULL);
	assert(cmsg != NULL);

	cmsg->rm_direction = CALL;
	cmsg->rm_call.cb_rpcvers = RPC_MSG_VERSION;
	if ((xdrs->x_op == XDR_ENCODE)
	    && inline_xdr_u_int32_t(xdrs, &(cmsg->rm_xid))
	    && inline_xdr_enum(xdrs, (enum_t *) &(cmsg->rm_direction))
	    && inline_xdr_u_int32_t(xdrs, &(cmsg->rm_call.cb_rpcvers))
	    && inline_xdr_u_int32_t(xdrs, &(cmsg->cb_prog)))
		return (inline_xdr_u_int32_t(xdrs, &(cmsg->cb_vers)));
	return (false);
}